

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_initCStream_srcSize(ZSTD_CStream *zcs,int compressionLevel,unsigned_long_long pss)

{
  ZSTD_cStreamStage ZVar1;
  int iVar2;
  size_t sVar3;
  unsigned_long_long uVar4;
  int iVar5;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = 0;
  sVar3 = ZSTD_CCtx_refCDict(zcs,(ZSTD_CDict *)0x0);
  if (sVar3 < 0xffffffffffffff89) {
    ZVar1 = zcs->streamStage;
    if (ZVar1 != zcss_init) {
      zcs->cParamsChanged = 1;
    }
    if (compressionLevel == 0) {
      iVar2 = 3;
    }
    else {
      iVar5 = -0x20000;
      if (-0x20000 < compressionLevel) {
        iVar5 = compressionLevel;
      }
      iVar2 = 0x16;
      if (iVar5 < 0x16) {
        iVar2 = iVar5;
      }
    }
    (zcs->requestedParams).compressionLevel = iVar2;
    sVar3 = 0xffffffffffffffc4;
    if (ZVar1 == zcss_init) {
      uVar4 = pss + 1;
      if (pss == 0) {
        uVar4 = 0;
      }
      zcs->pledgedSrcSizePlusOne = uVar4;
      sVar3 = 0;
    }
  }
  return sVar3;
}

Assistant:

size_t ZSTD_initCStream_srcSize(ZSTD_CStream* zcs, int compressionLevel, unsigned long long pss)
{
    /* temporary : 0 interpreted as "unknown" during transition period.
     * Users willing to specify "unknown" **must** use ZSTD_CONTENTSIZE_UNKNOWN.
     * 0 will be interpreted as "empty" in the future.
     */
    U64 const pledgedSrcSize = (pss==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_srcSize");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, NULL) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    return 0;
}